

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrapMode.cpp
# Opt level: O0

bool wasm::isTruncOpSigned(UnaryOp op)

{
  bool local_9;
  UnaryOp op_local;
  
  if ((op - TruncUFloat32ToInt32 < 2) || (op == TruncUFloat64ToInt32 || op == TruncUFloat64ToInt64))
  {
    local_9 = false;
  }
  else {
    local_9 = true;
  }
  return local_9;
}

Assistant:

bool isTruncOpSigned(UnaryOp op) {
  switch (op) {
    case TruncUFloat32ToInt32:
    case TruncUFloat32ToInt64:
    case TruncUFloat64ToInt32:
    case TruncUFloat64ToInt64:
      return false;
    default:
      return true;
  }
}